

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseSignal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_SignalType_t SigType)

{
  char cVar1;
  int iVar2;
  char *__s1;
  Ver_SignalType_t VVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  int nLsb;
  int nMsb;
  char Buffer [1000];
  uint local_44c;
  char *local_440;
  uint local_438;
  Ver_SignalType_t local_434;
  uint local_430;
  uint local_42c;
  Ver_Man_t *local_428;
  Ver_Stream_t *local_420;
  char local_418 [1000];
  
  local_420 = pMan->pReader;
  uVar5 = 0xffffffff;
  local_430 = 0xffffffff;
  local_42c = 0xffffffff;
  __s1 = Ver_ParseGetName(pMan);
  if (__s1 != (char *)0x0) {
    local_434 = SigType & ~VER_SIG_OUTPUT;
    VVar3 = SigType & ~VER_SIG_INPUT;
    local_44c = 0xffffffff;
    local_428 = pMan;
    do {
      local_440 = __s1;
      iVar2 = strcmp(__s1,"wire");
      if (iVar2 != 0) {
        if ((*__s1 == '[') && (pMan->fNameLast == 0)) {
          if ((local_44c != 0xffffffff) || (uVar5 != 0xffffffff)) {
            __assert_fail("nMsb == -1 && nLsb == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x338,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
          }
          Ver_ParseSignalPrefix(pMan,&local_440,(int *)&local_42c,(int *)&local_430);
          __s1 = local_440;
          if ((*local_440 == '\0') &&
             (__s1 = Ver_ParseGetName(pMan), local_440 = __s1, __s1 == (char *)0x0)) {
            return 0;
          }
        }
        uVar5 = local_42c;
        local_438 = local_430;
        local_44c = local_42c;
        if ((local_42c & local_430) == 0xffffffff) {
          if (local_434 == VER_SIG_INPUT) {
            Ver_ParseCreatePi(pNtk,__s1);
          }
          if (VVar3 == VER_SIG_REG) {
            Abc_NtkFindOrCreateNet(pNtk,local_440);
          }
          else if (VVar3 == VER_SIG_OUTPUT) {
            Ver_ParseCreatePo(pNtk,local_440);
          }
        }
        else {
          if (((int)local_42c < 0) || ((int)local_430 < 0)) {
            __assert_fail("nMsb >= 0 && nLsb >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x350,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
          }
          iVar2 = local_430 - local_42c;
          if (local_430 < local_42c) {
            iVar2 = -(local_430 - local_42c);
          }
          Ver_ParseInsertsSuffix(pMan,__s1,local_42c,local_430);
          if (-1 < iVar2) {
            bVar6 = local_438 < uVar5;
            iVar4 = iVar2 + 1;
            uVar5 = local_438;
            do {
              if (iVar2 == 0) {
                strcpy(local_418,__s1);
              }
              else {
                sprintf(local_418,"%s[%d]",__s1,(ulong)uVar5);
              }
              if (local_434 == VER_SIG_INPUT) {
                Ver_ParseCreatePi(pNtk,local_418);
              }
              if (VVar3 == VER_SIG_REG) {
                Abc_NtkFindOrCreateNet(pNtk,local_418);
              }
              else if (VVar3 == VER_SIG_OUTPUT) {
                Ver_ParseCreatePo(pNtk,local_418);
              }
              uVar5 = uVar5 + (bVar6 - 1 | 1);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
        }
        cVar1 = Ver_StreamPopChar(local_420);
        pMan = local_428;
        uVar5 = local_438;
        if (cVar1 != ',') {
          if (cVar1 != ';') {
            builtin_strncpy(local_428->sError + 0x1c,"pected ,",8);
            builtin_strncpy(local_428->sError + 0x24," or ;).",8);
            builtin_strncpy(local_428->sError + 0x10,"nal line",8);
            builtin_strncpy(local_428->sError + 0x18," (expect",8);
            builtin_strncpy(local_428->sError,"Cannot p",8);
            builtin_strncpy(local_428->sError + 8,"arse sig",8);
            Ver_ParsePrintErrorMessage(local_428);
            return 0;
          }
          return 1;
        }
      }
      __s1 = Ver_ParseGetName(pMan);
    } while (__s1 != (char *)0x0);
  }
  return 0;
}

Assistant:

int Ver_ParseSignal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_SignalType_t SigType )
{
    Ver_Stream_t * p = pMan->pReader;
    char Buffer[1000], Symbol, * pWord;
    int nMsb, nLsb, Bit, Limit, i;
    nMsb = nLsb = -1;
    while ( 1 )
    {
        // get the next word
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;

        if ( !strcmp(pWord, "wire") )
            continue;

        // check if the range is specified
        if ( pWord[0] == '[' && !pMan->fNameLast )
        {
            assert( nMsb == -1 && nLsb == -1 );
            Ver_ParseSignalPrefix( pMan, &pWord, &nMsb, &nLsb );
            // check the case when there is space between bracket and the next word
            if ( *pWord == 0 )
            {
                // get the signal name
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;
            }
        }

        // create signals
        if ( nMsb == -1 && nLsb == -1 )
        {
            if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePi( pNtk, pWord );
            if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePo( pNtk, pWord );
            if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                Abc_NtkFindOrCreateNet( pNtk, pWord );
        }
        else
        {
            assert( nMsb >= 0 && nLsb >= 0 );
            // add to the hash table
            Ver_ParseInsertsSuffix( pMan, pWord, nMsb, nLsb );
            // add signals from Lsb to Msb
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
//                sprintf( Buffer, "%s[%d]", pWord, Bit );
                if ( Limit > 1 )
                    sprintf( Buffer, "%s[%d]", pWord, Bit );
                else
                    sprintf( Buffer, "%s", pWord );
                if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePi( pNtk, Buffer );
                if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePo( pNtk, Buffer );
                if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                    Abc_NtkFindOrCreateNet( pNtk, Buffer );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
        break;
    }
    sprintf( pMan->sError, "Cannot parse signal line (expected , or ;)." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}